

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O1

success<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>_>
* __thiscall
toml::
ok<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,toml::detail::region>>
          (success<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>_>
           *__return_storage_ptr__,toml *this,
          pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
          *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  size_type sVar6;
  pointer pbVar7;
  pointer pbVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  region local_80;
  
  pbVar7 = *(pointer *)this;
  pbVar8 = *(pointer *)(this + 8);
  paVar2 = &local_80.source_name_.field_2;
  pbVar3 = *(pointer *)(this + 0x10);
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  peVar4 = *(element_type **)(this + 0x18);
  p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x20);
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this + 0x38);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)(this + 0x28) == paVar1) {
    local_80.source_name_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_80.source_name_.field_2._8_8_ = *(undefined8 *)(this + 0x40);
    local_80.source_name_._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_80.source_name_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_80.source_name_._M_dataplus._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(this + 0x28);
  }
  sVar6 = *(size_type *)(this + 0x30);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)(this + 0x28) = paVar1;
  *(undefined8 *)(this + 0x30) = 0;
  this[0x38] = (toml)0x0;
  local_80.last_column_ = *(size_t *)(this + 0x78);
  local_80.length_ = *(size_t *)(this + 0x48);
  local_80.first_ = *(size_t *)(this + 0x50);
  local_80.first_line_ = *(size_t *)(this + 0x58);
  local_80.first_column_ = *(size_t *)(this + 0x60);
  local_80.last_ = *(size_t *)(this + 0x68);
  local_80.last_line_ = *(size_t *)(this + 0x70);
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->value).first.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar3;
  (__return_storage_ptr__->value).second.source_.
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar4;
  (__return_storage_ptr__->value).first.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar7;
  (__return_storage_ptr__->value).first.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar8;
  (__return_storage_ptr__->value).second.source_.
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_80.source_.
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->value).second.source_.
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var5;
  local_80.source_.
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  paVar1 = &(__return_storage_ptr__->value).second.source_name_.field_2;
  (__return_storage_ptr__->value).second.source_name_._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.source_name_._M_dataplus._M_p == paVar2) {
    paVar1->_M_allocated_capacity = local_80.source_name_.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->value).second.source_name_.field_2 + 8) =
         local_80.source_name_.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->value).second.source_name_._M_dataplus._M_p =
         local_80.source_name_._M_dataplus._M_p;
    (__return_storage_ptr__->value).second.source_name_.field_2._M_allocated_capacity =
         local_80.source_name_.field_2._M_allocated_capacity;
  }
  (__return_storage_ptr__->value).second.source_name_._M_string_length = sVar6;
  local_80.source_name_._M_string_length = 0;
  local_80.source_name_.field_2._M_allocated_capacity =
       local_80.source_name_.field_2._M_allocated_capacity & 0xffffffffffffff00;
  (__return_storage_ptr__->value).second.last_column_ = *(size_t *)(this + 0x78);
  sVar9 = *(size_t *)(this + 0x48);
  sVar10 = *(size_t *)(this + 0x50);
  sVar11 = *(size_t *)(this + 0x58);
  sVar12 = *(size_t *)(this + 0x60);
  sVar13 = *(size_t *)(this + 0x70);
  (__return_storage_ptr__->value).second.last_ = *(size_t *)(this + 0x68);
  (__return_storage_ptr__->value).second.last_line_ = sVar13;
  (__return_storage_ptr__->value).second.first_line_ = sVar11;
  (__return_storage_ptr__->value).second.first_column_ = sVar12;
  (__return_storage_ptr__->value).second.length_ = sVar9;
  (__return_storage_ptr__->value).second.first_ = sVar10;
  local_80.source_name_._M_dataplus._M_p = (pointer)paVar2;
  detail::region::~region(&local_80);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return __return_storage_ptr__;
}

Assistant:

success<typename std::decay<T>::type> ok(T&& v)
{
    return success<typename std::decay<T>::type>(std::forward<T>(v));
}